

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,int64_t *value)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  StreamReader *pSVar4;
  uint __val;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined8 *puVar8;
  int iVar9;
  size_type *psVar10;
  ulong uVar11;
  long extraout_RDX;
  long lVar12;
  long lVar13;
  char *pcVar14;
  byte *pbVar15;
  _Alloc_hider _Var16;
  undefined8 uVar17;
  char *pcVar18;
  uint __len;
  long lVar19;
  byte *pbVar20;
  uint uVar21;
  char c;
  string __str;
  char sc;
  stringstream ss;
  string local_258;
  string local_238;
  long *local_218 [2];
  long local_208 [2];
  char local_1f8;
  undefined7 uStack_1f7;
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar7 = Char1(this,&local_1f8);
  if (bVar7) {
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + 1;
    bVar7 = true;
    if (local_1f8 == '+') {
      bVar5 = false;
      bVar6 = true;
    }
    else if (local_1f8 == '-') {
      bVar6 = true;
      bVar5 = true;
    }
    else {
      if (9 < (byte)(local_1f8 - 0x30U)) {
        uVar21 = (uint)local_1f8;
        __val = -uVar21;
        if (0 < (int)uVar21) {
          __val = uVar21;
        }
        __len = 1;
        if (9 < __val) {
          __len = 3 - (__val < 100);
        }
        local_218[0] = local_208;
        ::std::__cxx11::string::_M_construct((ulong)local_218,(char)__len - (local_1f8 >> 7));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)local_218[0] + (ulong)(uVar21 >> 0x1f)),__len,__val);
        puVar8 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x40b5c0);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_258.field_2._M_allocated_capacity = *psVar10;
          local_258.field_2._8_8_ = puVar8[3];
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar10;
          local_258._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_258._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_258);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_238.field_2._M_allocated_capacity = *psVar10;
          local_238.field_2._8_8_ = puVar8[3];
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        }
        else {
          local_238.field_2._M_allocated_capacity = *psVar10;
          local_238._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_238._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        PushError(this,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_218[0] != local_208) {
          operator_delete(local_218[0],local_208[0] + 1);
        }
        goto LAB_003c4955;
      }
      bVar6 = false;
      bVar5 = false;
    }
    local_238._M_dataplus._M_p._0_1_ = local_1f8;
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_238,1);
  }
  else {
LAB_003c4955:
    bVar6 = false;
    bVar5 = false;
    bVar7 = false;
  }
  if (bVar7) {
    if (bVar5) {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,"Unsigned value expected but got \'-\' sign.","");
      PushError(this,&local_238);
      uVar17 = local_238.field_2._M_allocated_capacity;
      _Var16._M_p = local_238._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_003c4b79;
    }
    else {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_003c4a38;
        bVar7 = Char1(this,(char *)&local_258);
        iVar9 = 1;
        if (bVar7) {
          if ((byte)((char)local_258._M_dataplus._M_p - 0x30U) < 10) {
            local_238._M_dataplus._M_p._0_1_ = (char)local_258._M_dataplus._M_p;
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_238,1);
            iVar9 = 0;
          }
          else {
            pSVar4 = this->_sr;
            iVar9 = 3;
            if ((0 < (long)pSVar4->idx_) && (uVar11 = pSVar4->idx_ - 1, uVar11 <= pSVar4->length_))
            {
              pSVar4->idx_ = uVar11;
            }
          }
        }
      } while (iVar9 == 0);
      if (iVar9 == 3) {
LAB_003c4a38:
        if (bVar6) {
          ::std::__cxx11::stringbuf::str();
          bVar7 = local_238._M_string_length == 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar7 = false;
        }
        if (bVar7) {
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,"Integer value expected but got sign character only.\n",""
                    );
          PushError(this,&local_258);
          uVar17 = local_258.field_2._M_allocated_capacity;
          _Var16._M_p = local_258._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
LAB_003c4b79:
            operator_delete(_Var16._M_p,uVar17 + 1);
          }
        }
        else {
          ::std::__cxx11::stringbuf::str();
          if (local_258._M_string_length < 2) {
            bVar7 = false;
          }
          else {
            ::std::__cxx11::stringbuf::str();
            bVar7 = (char)*local_218[0] == '0';
            if (local_218[0] != local_208) {
              operator_delete(local_218[0],local_208[0] + 1);
            }
          }
          paVar2 = &local_258.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != paVar2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if (!bVar7) {
            ::std::__cxx11::stringbuf::str();
            _Var16._M_p = local_258._M_dataplus._M_p;
            ::std::__cxx11::stringbuf::str();
            lVar13 = CONCAT71(uStack_1f7,local_1f8);
            ::std::__cxx11::stringbuf::str();
            pbVar20 = (byte *)(lVar13 + local_1d0);
            iVar9 = -1;
            if ((byte *)_Var16._M_p == pbVar20) {
LAB_003c4e4b:
              lVar13 = 0;
            }
            else {
              if (*_Var16._M_p == 0x2d) {
                pbVar15 = (byte *)(_Var16._M_p + 1);
                if (pbVar15 == pbVar20) goto LAB_003c4e4b;
                lVar12 = extraout_RDX;
                lVar13 = 0;
                iVar9 = -1;
                do {
                  bVar3 = *pbVar15;
                  lVar19 = lVar13;
                  if (((ulong)bVar3 < 0x21) && ((0x100003e01U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
                    iVar9 = 0;
                    bVar7 = false;
                  }
                  else {
                    if ((byte)(bVar3 - 0x3a) < 0xf6) {
                      iVar9 = -1;
                    }
                    else {
                      if ((-0xccccccccccccccd < lVar13) &&
                         (lVar13 != -0xccccccccccccccc || (byte)(bVar3 - 0x30) < 9)) {
                        lVar19 = lVar13 * 10;
                        bVar7 = true;
                        lVar13 = lVar12;
                        lVar19 = lVar19 - (ulong)(byte)(bVar3 - 0x30);
                        goto LAB_003c4c4d;
                      }
                      iVar9 = -4;
                    }
                    bVar7 = false;
                  }
LAB_003c4c4d:
                  if (!bVar7) goto LAB_003c4d53;
                  pbVar15 = pbVar15 + 1;
                  lVar12 = lVar13;
                  lVar13 = lVar19;
                } while (pbVar15 < pbVar20);
              }
              else {
                if (*_Var16._M_p == 0x2b) {
                  _Var16._M_p = _Var16._M_p + 1;
                }
                if ((byte *)_Var16._M_p == pbVar20) goto LAB_003c4e4b;
                lVar12 = extraout_RDX;
                lVar13 = 0;
                iVar9 = -1;
                do {
                  bVar3 = *_Var16._M_p;
                  lVar19 = lVar13;
                  if (((ulong)bVar3 < 0x21) && ((0x100003e01U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
                    iVar9 = 0;
                    bVar7 = false;
                  }
                  else {
                    if ((byte)(bVar3 - 0x3a) < 0xf6) {
                      iVar9 = -1;
                    }
                    else {
                      if ((lVar13 < 0xccccccccccccccd) &&
                         (lVar13 != 0xccccccccccccccc || (byte)(bVar3 - 0x30) < 8)) {
                        lVar19 = lVar13 * 10;
                        bVar7 = true;
                        lVar13 = lVar12;
                        lVar19 = (ulong)(byte)(bVar3 - 0x30) + lVar19;
                        goto LAB_003c4cf1;
                      }
                      iVar9 = -3;
                    }
                    bVar7 = false;
                  }
LAB_003c4cf1:
                  if (!bVar7) goto LAB_003c4d53;
                  _Var16._M_p = _Var16._M_p + 1;
                  lVar12 = lVar13;
                  lVar13 = lVar19;
                } while (_Var16._M_p < pbVar20);
              }
              iVar9 = 0;
              lVar13 = lVar19;
            }
LAB_003c4d53:
            paVar2 = &local_258.field_2;
            if (local_1d8 != local_1c8) {
              operator_delete(local_1d8,local_1c8[0] + 1);
            }
            if ((long *)CONCAT71(uStack_1f7,local_1f8) != local_1e8) {
              operator_delete((long *)CONCAT71(uStack_1f7,local_1f8),local_1e8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != paVar2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
            bVar7 = iVar9 == 0;
            if (bVar7) {
              *value = lVar13;
            }
            else {
              if (iVar9 == -3) {
                pcVar18 = "Integer value overflows.\n";
                pcVar14 = "";
              }
              else if (iVar9 == -2) {
                pcVar18 = "Negative sign `-` specified for uint32 integer.\n";
                pcVar14 = "";
              }
              else if (iVar9 == -1) {
                pcVar18 = "Not an 32bit unsigned integer literal.\n";
                pcVar14 = "";
              }
              else {
                pcVar18 = "Invalid integer literal\n";
                pcVar14 = "";
              }
              local_258._M_dataplus._M_p = (pointer)paVar2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_258,pcVar18,pcVar14);
              PushError(this,&local_258);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != paVar2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
            }
            goto LAB_003c4b83;
          }
          local_258._M_dataplus._M_p = (pointer)paVar2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,"Zero padded integer value is not allowed.\n","");
          PushError(this,&local_258);
          uVar17 = local_258.field_2._M_allocated_capacity;
          _Var16._M_p = local_258._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != paVar2) goto LAB_003c4b79;
        }
      }
    }
  }
  bVar7 = false;
LAB_003c4b83:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar7;
}

Assistant:

bool AsciiParser::ReadBasicType(int64_t *value) {
  std::stringstream ss;

  // head character
  bool has_sign = false;
  bool negative = false;
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign or [0-9]
    if (sc == '+') {
      negative = false;
      has_sign = true;
    } else if (sc == '-') {
      negative = true;
      has_sign = true;
    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
    } else {
      PushError("Sign or 0-9 expected, but got '" + std::to_string(sc) +
                "'.\n");
      return false;
    }

    ss << sc;
  }

  if (negative) {
    PushError("Unsigned value expected but got '-' sign.");
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if ((c >= '0') && (c <= '9')) {
      ss << c;
    } else {
      _sr->seek_from_current(-1);
      break;
    }
  }

  if (has_sign && (ss.str().size() == 1)) {
    // sign only
    PushError("Integer value expected but got sign character only.\n");
    return false;
  }

  if ((ss.str().size() > 1) && (ss.str()[0] == '0')) {
    PushError("Zero padded integer value is not allowed.\n");
    return false;
  }

  // std::cout << "ReadInt token: " << ss.str() << "\n";

  // TODO(syoyo): Use ryu parse.
#if defined(__cpp_exceptions) || defined(__EXCEPTIONS)
  try {
    (*value) = std::stoull(ss.str());
  } catch (const std::invalid_argument &e) {
    (void)e;
    PushError("Not an 64bit unsigned integer literal.\n");
    return false;
  } catch (const std::out_of_range &e) {
    (void)e;
    PushError("64bit unsigned integer value out of range.\n");
    return false;
  }

  return true;
#else
  // use jsteemann/atoi
  int retcode;
  auto result = jsteemann::atoi<int64_t>(
      ss.str().c_str(), ss.str().c_str() + ss.str().size(), retcode);
  if (retcode == jsteemann::SUCCESS) {
    (*value) = result;
    return true;
  } else if (retcode == jsteemann::INVALID_INPUT) {
    PushError("Not an 32bit unsigned integer literal.\n");
    return false;
  } else if (retcode == jsteemann::INVALID_NEGATIVE_SIGN) {
    PushError("Negative sign `-` specified for uint32 integer.\n");
    return false;
  } else if (retcode == jsteemann::VALUE_OVERFLOW) {
    PushError("Integer value overflows.\n");
    return false;
  }

  PushError("Invalid integer literal\n");
  return false;
#endif

  // std::cout << "read int ok\n";
}